

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult __thiscall
testing::internal::CmpHelperEQ<int,short>
          (internal *this,char *expected_expression,char *actual_expression,int *expected,
          short *actual)

{
  int *piVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar3;
  string local_70;
  string local_50;
  internal *local_30;
  short *actual_local;
  int *expected_local;
  char *actual_expression_local;
  char *expected_expression_local;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  piVar1 = (int *)(ulong)(uint)(int)*actual;
  local_30 = (internal *)actual;
  actual_local = (short *)expected;
  expected_local = (int *)actual_expression;
  actual_expression_local = expected_expression;
  expected_expression_local = (char *)this;
  if (*expected == (int)*actual) {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    FormatForComparisonFailureMessage<int,short>
              (&local_50,(internal *)expected,(int *)actual,(short *)piVar1);
    FormatForComparisonFailureMessage<short,int>(&local_70,local_30,actual_local,piVar1);
    EqFailure(this,expected_expression,actual_expression,&local_50,&local_70,false);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    sVar2.ptr_ = extraout_RDX;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}